

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O0

void PrintIndented(ExpressionGraphContext *ctx,InplaceStr name,TypeBase *type,char *format,...)

{
  char in_AL;
  bool bVar1;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [40];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_48 [8];
  va_list args;
  char *format_local;
  TypeBase *type_local;
  ExpressionGraphContext *ctx_local;
  InplaceStr name_local;
  
  name_local.begin = name.end;
  ctx_local = (ExpressionGraphContext *)name.begin;
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_d0 = in_R9;
  args[0].reg_save_area = format;
  PrintIndent(ctx);
  bVar1 = InplaceStr::empty((InplaceStr *)&ctx_local);
  if (!bVar1) {
    OutputContext::Print(ctx->output,(char *)ctx_local,(int)name_local.begin - (int)ctx_local);
    OutputContext::Print(ctx->output,": ");
  }
  if (type != (TypeBase *)0x0) {
    bVar1 = InplaceStr::empty(&type->name);
    if (!bVar1) {
      OutputContext::Print
                (ctx->output,(type->name).begin,(int)(type->name).end - (int)(type->name).begin);
      OutputContext::Print(ctx->output," ");
    }
  }
  args[0].overflow_arg_area = local_f8;
  args[0]._0_8_ = &stack0x00000008;
  local_48._4_4_ = 0x30;
  local_48._0_4_ = 0x28;
  OutputContext::Print(ctx->output,(char *)args[0].reg_save_area,(__va_list_tag *)local_48);
  OutputContext::Print(ctx->output,"\n");
  return;
}

Assistant:

void PrintIndented(ExpressionGraphContext &ctx, InplaceStr name, TypeBase *type, const char *format, ...)
{
	PrintIndent(ctx);

	if(!name.empty())
	{
		ctx.output.Print(name.begin, unsigned(name.end - name.begin));
		ctx.output.Print(": ");
	}

	if(type && !type->name.empty())
	{
		ctx.output.Print(type->name.begin, unsigned(type->name.end - type->name.begin));
		ctx.output.Print(" ");
	}

	va_list args;
	va_start(args, format);

	ctx.output.Print(format, args);

	va_end(args);

	ctx.output.Print("\n");
}